

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  CapTableBuilder *capTable;
  BuilderArena *pBVar2;
  uint uVar3;
  int iVar4;
  WirePointer *pWVar5;
  SegmentBuilder *this_00;
  SegmentBuilder *pSVar6;
  unsigned_long uVar7;
  undefined8 *puVar8;
  word *pwVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  word *pwVar16;
  uint value;
  int iVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  AllocateResult AVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  ElementSize oldSize;
  uint local_f4;
  WirePointer *local_f0;
  AllocateResult local_e8;
  uint local_d4;
  ulong local_d0;
  WirePointer *local_c8;
  WirePointer *local_c0;
  ulong local_b8;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Iterator __end5;
  WirePointer *local_80;
  WirePointer *local_78;
  Fault f;
  
  local_e8.words = (word *)this->pointer;
  local_e8.segment = this->segment;
  capTable = this->capTable;
  uVar18 = (((WirePointer *)local_e8.words)->offsetAndKind).value;
  local_f0 = (WirePointer *)CONCAT44(local_f0._4_4_,elementSize);
  local_f4 = (uint)elementSize >> 0x10;
  local_d0 = (ulong)local_f4;
  if ((((WirePointer *)local_e8.words)->field_1).upper32Bits == 0 && uVar18 == 0) goto LAB_002e446a;
  pWVar5 = (WirePointer *)local_e8.words + (long)((int)uVar18 >> 2) + 1;
  do {
    pwVar9 = local_e8.words;
    pWVar14 = (WirePointer *)local_e8.words;
    this_00 = local_e8.segment;
    if ((uVar18 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)((local_e8.segment)->super_SegmentReader).arena,
                           (SegmentId)
                           ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_e8.words + 4))
                           ->structRef);
      uVar18 = ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value;
      pwVar9 = (this_00->super_SegmentReader).ptr.ptr;
      uVar12 = (ulong)(uVar18 & 0xfffffff8);
      pWVar15 = (WirePointer *)((long)&pwVar9->content + uVar12);
      pWVar14 = (WirePointer *)((long)&pwVar9[1].content + uVar12);
      if ((uVar18 & 4) == 0) {
        pWVar5 = pWVar14 + ((int)(pWVar15->offsetAndKind).value >> 2);
        pWVar14 = pWVar15;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar15->field_1).structRef);
        pWVar5 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar15->offsetAndKind).value & 0xfffffff8));
      }
    }
    pwVar9 = local_e8.words;
    pSVar6 = local_e8.segment;
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar14->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      uVar18 = (pWVar14->field_1).upper32Bits;
      oldSize = (ElementSize)uVar18 & INLINE_COMPOSITE;
      if (oldSize == INLINE_COMPOSITE) {
        uVar18 = (uint)*(uint64_t *)&(pWVar5->offsetAndKind).value;
        _kjCondition.result = (uVar18 & 3) == 0;
        _kjCondition._0_8_ = (ulong)uVar18 & 0xffffffff00000003;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if (_kjCondition.result) {
          local_78 = pWVar5 + 1;
          uVar1 = *(ushort *)&pWVar5->field_1;
          uVar10 = *(ushort *)((long)&pWVar5->field_1 + 2);
          local_d0._0_4_ = (uint)uVar10 + (uint)uVar1;
          local_b8 = (ulong)(uint)local_d0;
          value = (uint)*(uint64_t *)&(pWVar5->offsetAndKind).value >> 2 & 0x1fffffff;
          local_d4 = (uint)uVar1;
          if (uVar10 < (ushort)local_f4 || uVar1 < (ushort)local_f0) {
            uVar18 = local_d4;
            if (uVar1 <= (ushort)local_f0) {
              uVar18 = (uint)local_f0;
            }
            if ((ushort)local_f4 < uVar10) {
              local_f4 = (uint)uVar10;
            }
            local_d4 = uVar18 & 0xffff;
            local_d0 = (ulong)((local_f4 & 0xffff) + local_d4);
            local_c8 = local_78;
            local_c0 = pWVar5;
            local_f0 = (WirePointer *)
                       assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_1_>
                                 (value * local_d0,(anon_class_1_0_00000001 *)&_kjCondition);
            pwVar9 = local_e8.words;
            if (((((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value & 3) == 2) &&
               (pSVar6 = BuilderArena::getSegment
                                   ((BuilderArena *)((local_e8.segment)->super_SegmentReader).arena,
                                    (SegmentId)
                                    ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                    ((long)local_e8.words + 4))->structRef),
               pSVar6->readOnly == false)) {
              uVar3 = ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value;
              puVar8 = (undefined8 *)
                       ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar3 & 0xfffffff8));
              if ((uVar3 & 4) == 0) {
                *puVar8 = 0;
              }
              else {
                *puVar8 = 0;
                puVar8[1] = 0;
              }
            }
            iVar4 = (int)local_f0;
            *pwVar9 = 0;
            uVar12 = (long)local_f0 + 1;
            if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_e8.words + 4))->
                upper32Bits != 0 ||
                ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value != 0) {
              WireHelpers::zeroObject(local_e8.segment,capTable,(WirePointer *)local_e8.words);
              iVar4 = (int)local_f0;
            }
            AVar23.words = local_e8.words;
            AVar23.segment = local_e8.segment;
            pwVar9 = (local_e8.segment)->pos;
            uVar12 = uVar12 & 0xffffffff;
            if (((long)((long)((local_e8.segment)->super_SegmentReader).ptr.ptr +
                       (((local_e8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >>
                 3 < (long)uVar12) ||
               ((local_e8.segment)->pos = pwVar9 + uVar12, pwVar9 == (word *)0x0)) {
              pBVar2 = (BuilderArena *)((local_e8.segment)->super_SegmentReader).arena;
              uVar3 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                ((int)local_f0 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
              AVar23 = BuilderArena::allocate(pBVar2,uVar3);
              iVar4 = (int)local_f0;
              ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value =
                   (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
                   0xfffffff8U | 2;
              *(uint *)((long)local_e8.words + 4) = ((AVar23.segment)->super_SegmentReader).id.value
              ;
              *(undefined4 *)&(AVar23.words)->content = 1;
              pwVar9 = AVar23.words + 1;
            }
            else {
              ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value =
                   ((uint)((ulong)((long)pwVar9 - (long)local_e8.words) >> 1) & 0xfffffffc) - 3;
            }
            local_e8.words = AVar23.words;
            *(int *)((long)&(local_e8.words)->content + 4) = iVar4 * 8 + 7;
            *(uint *)&pwVar9->content = value * 4;
            *(short *)((long)&pwVar9->content + 4) = (short)uVar18;
            *(short *)((long)&pwVar9->content + 6) = (short)local_f4;
            uVar12 = local_b8 & 0xffffffff;
            local_80 = (WirePointer *)(pwVar9 + ((ulong)uVar18 & 0xffff) + 1);
            local_78 = (WirePointer *)(pwVar9 + 1);
            iVar4 = (int)local_d0;
            pWVar5 = local_c0 + (ulong)uVar1 + 1;
            local_b8 = (ulong)(uint)((int)local_b8 << 3);
            local_f0 = local_78;
            for (uVar18 = 0; pWVar14 = local_c0, uVar3 = local_f4, local_e8 = AVar23,
                uVar18 != value; uVar18 = uVar18 + 1) {
              pWVar14 = local_80;
              pWVar15 = pWVar5;
              uVar13 = (ulong)uVar10;
              if (uVar1 != 0) {
                memcpy(local_f0,local_c8,(ulong)uVar1 * 8);
                AVar23 = local_e8;
              }
              while( true ) {
                local_e8.segment = AVar23.segment;
                if (uVar13 == 0) break;
                WireHelpers::transferPointer(local_e8.segment,pWVar14,this_00,pWVar15);
                local_e8 = AVar23;
                pWVar14 = pWVar14 + 1;
                pWVar15 = pWVar15 + 1;
                uVar13 = uVar13 - 1;
                AVar23 = local_e8;
              }
              local_f0 = local_f0 + local_d0;
              local_c8 = local_c8 + uVar12;
              local_80 = (WirePointer *)
                         ((long)&(local_80->offsetAndKind).value + (ulong)(uint)(iVar4 * 8));
              pWVar5 = (WirePointer *)((long)&(pWVar5->offsetAndKind).value + local_b8);
            }
            uVar7 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_2_>
                              (uVar12 * value,(anon_class_1_0_00000001 *)&_kjCondition);
            iVar4 = (int)uVar7 + 1;
            if (iVar4 != 0) {
              memset(pWVar14,0,(ulong)(uint)(iVar4 * 8));
            }
            local_f4 = uVar3;
LAB_002e4de2:
            uVar10 = (ushort)local_f4;
            this_00 = local_e8.segment;
          }
          goto LAB_002e4dee;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   &_kjCondition,
                   (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      }
      else {
        bVar20 = oldSize == POINTER;
        value = uVar18 >> 3;
        uVar12 = (ulong)value;
        if ((uVar18 & 7) == 0) {
          AVar21.words = local_e8.words;
          AVar21.segment = local_e8.segment;
          value = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                            (value,(anon_class_1_0_00000001 *)&_kjCondition);
          local_d4 = (uint)(ushort)local_f0;
          local_d0 = (ulong)((int)local_d0 + local_d4);
          uVar7 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                            (local_d0 * value,(anon_class_1_0_00000001 *)&_kjCondition);
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar9 + 4))->upper32Bits != 0 ||
              ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value != 0) {
            WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)pwVar9);
          }
          pwVar16 = pSVar6->pos;
          uVar12 = uVar7 + 1 & 0xffffffff;
          if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                     ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar16)) >> 3 <
               (long)uVar12) || (pSVar6->pos = pwVar16 + uVar12, pwVar16 == (word *)0x0)) {
            pBVar2 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
            uVar18 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                               ((int)uVar7 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
            AVar21 = BuilderArena::allocate(pBVar2,uVar18);
            ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value =
                 (int)AVar21.words - *(int *)&((AVar21.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)pwVar9 + 4) = ((AVar21.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar21.words)->content = 1;
            pwVar16 = AVar21.words + 1;
          }
          else {
            ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value =
                 ((uint)((ulong)((long)pwVar16 - (long)pwVar9) >> 1) & 0xfffffffc) - 3;
          }
          this_00 = AVar21.segment;
          *(int *)((long)&(AVar21.words)->content + 4) = (int)uVar7 * 8 + 7;
          *(uint *)&pwVar16->content = value << 2;
          *(short *)((long)&pwVar16->content + 4) = (short)local_f0;
          uVar10 = (ushort)local_f4;
          *(ushort *)((long)&pwVar16->content + 6) = uVar10;
          local_78 = (WirePointer *)(pwVar16 + 1);
LAB_002e4dee:
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = capTable;
          __return_storage_ptr__->ptr = (byte *)local_78;
          __return_storage_ptr__->elementCount = value;
          __return_storage_ptr__->step = (uint)local_d0 << 6;
          __return_storage_ptr__->structDataSize = local_d4 << 6;
          __return_storage_ptr__->structPointerCount = uVar10;
          goto LAB_002e4e1a;
        }
        uVar13 = (ulong)oldSize;
        local_b8 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + uVar13 * 4);
        _kjCondition._0_8_ = &oldSize;
        _kjCondition.op.content.ptr = "ion failed\", info";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_43885;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize != BIT) {
          if (oldSize == POINTER) {
            local_f4 = (int)local_d0 + (uint)((int)local_d0 == 0);
            local_d4 = (uint)local_f0;
          }
          else {
            local_d4 = ((uint)local_f0 & 0xffff) + (uint)(((ulong)local_f0 & 0xffff) == 0);
          }
          local_f0 = (WirePointer *)CONCAT44(local_f0._4_4_,local_d4);
          local_d4 = local_d4 & 0xffff;
          local_d0 = (ulong)((local_f4 & 0xffff) + local_d4);
          local_c0 = pWVar5;
          local_c8 = (WirePointer *)
                     assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_3_>
                               (local_d0 * uVar12,(anon_class_1_0_00000001 *)&_kjCondition);
          pwVar9 = local_e8.words;
          if (((((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value & 3) == 2) &&
             (pSVar6 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_e8.segment)->super_SegmentReader).arena,
                                  (SegmentId)
                                  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                  ((long)local_e8.words + 4))->structRef), pSVar6->readOnly == false
             )) {
            uVar18 = ((WireValue<uint32_t>_conflict *)&pwVar9->content)->value;
            puVar8 = (undefined8 *)
                     ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar18 & 0xfffffff8));
            if ((uVar18 & 4) == 0) {
              *puVar8 = 0;
            }
            else {
              *puVar8 = 0;
              puVar8[1] = 0;
            }
          }
          iVar4 = (int)local_c8;
          *pwVar9 = 0;
          uVar11 = (long)local_c8 + 1;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_e8.words + 4))->upper32Bits
              != 0 || ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value != 0) {
            WireHelpers::zeroObject(local_e8.segment,capTable,(WirePointer *)local_e8.words);
            iVar4 = (int)local_c8;
          }
          AVar22.words = local_e8.words;
          AVar22.segment = local_e8.segment;
          pwVar9 = (local_e8.segment)->pos;
          uVar11 = uVar11 & 0xffffffff;
          if (((long)((long)((local_e8.segment)->super_SegmentReader).ptr.ptr +
                     (((local_e8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3
               < (long)uVar11) || ((local_e8.segment)->pos = pwVar9 + uVar11, pwVar9 == (word *)0x0)
             ) {
            pBVar2 = (BuilderArena *)((local_e8.segment)->super_SegmentReader).arena;
            uVar18 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                               ((int)local_c8 + 2,(anon_class_1_0_00000001 *)&_kjCondition);
            AVar22 = BuilderArena::allocate(pBVar2,uVar18);
            iVar4 = (int)local_c8;
            ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value =
                 (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)local_e8.words + 4) = ((AVar22.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar22.words)->content = 1;
            pwVar9 = AVar22.words + 1;
          }
          else {
            ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value =
                 ((uint)((ulong)((long)pwVar9 - (long)local_e8.words) >> 1) & 0xfffffffc) - 3;
          }
          local_e8.words = AVar22.words;
          uVar18 = (uint)local_b8;
          *(int *)((long)&(local_e8.words)->content + 4) = iVar4 * 8 + 7;
          *(uint *)&pwVar9->content = value * 4;
          *(short *)((long)&pwVar9->content + 4) = (short)local_f0;
          *(short *)((long)&pwVar9->content + 6) = (short)local_f4;
          local_78 = (WirePointer *)(pwVar9 + 1);
          iVar4 = (int)local_d0;
          if (oldSize == POINTER) {
            pWVar5 = local_78 + ((uint)local_f0 & 0xffff);
            pWVar14 = local_c0;
            uVar3 = value;
            while( true ) {
              local_e8.segment = AVar22.segment;
              bVar19 = uVar3 == 0;
              uVar3 = uVar3 - 1;
              if (bVar19) break;
              WireHelpers::transferPointer(local_e8.segment,pWVar5,this_00,pWVar14);
              local_e8 = AVar22;
              pWVar14 = pWVar14 + 1;
              pWVar5 = (WirePointer *)
                       ((long)&(pWVar5->offsetAndKind).value + (ulong)(uint)(iVar4 * 8));
              AVar22 = local_e8;
            }
          }
          else {
            uVar11 = (ulong)(uVar18 >> 3);
            pWVar14 = (WirePointer *)(uVar13 - 6);
            pWVar5 = local_78;
            uVar13 = uVar12;
            pWVar15 = local_c0;
            local_c8 = pWVar14;
            while (iVar17 = (int)uVar13, uVar13 = (ulong)(iVar17 - 1), iVar17 != 0) {
              if (0xfffffffffffffffb < pWVar14) {
                local_e8 = AVar22;
                memcpy(pWVar5,pWVar15,uVar11);
                pWVar14 = local_c8;
                AVar22 = local_e8;
              }
              pWVar15 = (WirePointer *)((long)&(pWVar15->offsetAndKind).value + uVar11);
              pWVar5 = (WirePointer *)
                       ((long)&(pWVar5->offsetAndKind).value + (ulong)(uint)(iVar4 * 8));
            }
          }
          local_e8 = AVar22;
          uVar7 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_4_>
                            (((uint)bVar20 * 0x40 + uVar18) * uVar12 + 0x3f >> 6,
                             (anon_class_1_0_00000001 *)&_kjCondition);
          if ((int)uVar7 != 0) {
            memset(local_c0,0,(ulong)(uint)((int)uVar7 << 3));
          }
          goto LAB_002e4de2;
        }
        local_c0 = pWVar5;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [123])
                   "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
    }
    kj::_::Debug::Fault::~Fault(&f);
LAB_002e446a:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
LAB_002e4e1a:
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      return __return_storage_ptr__;
    }
    pWVar5 = (WirePointer *)
             WireHelpers::copyMessage
                       (&local_e8.segment,capTable,(WirePointer **)&local_e8.words,
                        (WirePointer *)defaultValue);
    uVar18 = ((WireValue<uint32_t>_conflict *)&(local_e8.words)->content)->value;
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}